

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

rnnvarset * copyvarset(rnnvarset *varset)

{
  int iVar1;
  rnnenum *prVar2;
  int *piVar3;
  rnnvarset *prVar4;
  int *piVar5;
  long lVar6;
  
  prVar4 = (rnnvarset *)calloc(0x10,1);
  prVar2 = varset->venum;
  prVar4->venum = prVar2;
  iVar1 = prVar2->valsnum;
  piVar5 = (int *)calloc(4,(long)iVar1);
  prVar4->variants = piVar5;
  if (0 < (long)iVar1) {
    piVar3 = varset->variants;
    lVar6 = 0;
    do {
      piVar5[lVar6] = piVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < prVar2->valsnum);
  }
  return prVar4;
}

Assistant:

static struct rnnvarset *copyvarset (struct rnnvarset *varset) {
	struct rnnvarset *res = calloc(sizeof *res, 1);
	res->venum = varset->venum;
	res->variants = calloc(sizeof *res->variants, res->venum->valsnum);
	int i;
	for (i = 0; i < res->venum->valsnum; i++)
		res->variants[i] = varset->variants[i];
	return res;
}